

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O2

int cmime_message_set_body(CMimeMessage_T *message,char *content)

{
  CMimePart_T *pCVar1;
  CMimeInfo_T *mi;
  char *pcVar2;
  int iVar3;
  
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x456,"int cmime_message_set_body(CMimeMessage_T *, const char *)");
  }
  if (content != (char *)0x0) {
    iVar3 = message->parts->size;
    if (message->boundary == (char *)0x0 || iVar3 < 2) {
      if (iVar3 == 1) {
        pCVar1 = (CMimePart_T *)cmime_list_pop_head(message->parts);
        cmime_part_free(pCVar1);
      }
      mi = cmime_util_info_get_from_string(content);
      if (mi != (CMimeInfo_T *)0x0) {
        if (mi->combined != (char *)0x0) {
          cmime_message_set_content_type(message,mi->combined);
        }
        cmime_util_info_free(mi);
      }
      pCVar1 = cmime_part_new();
      cmime_part_set_content(pCVar1,content);
      cmime_list_append(message->parts,pCVar1);
      iVar3 = 0;
      if (message->gap == (char *)0x0) {
        pcVar2 = message->linebreak;
        if (pcVar2 == (char *)0x0) {
          pcVar2 = "\r\n";
        }
        pcVar2 = strdup(pcVar2);
        message->gap = pcVar2;
        iVar3 = 0;
      }
    }
    else {
      iVar3 = -1;
    }
    return iVar3;
  }
  __assert_fail("content",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                ,0x457,"int cmime_message_set_body(CMimeMessage_T *, const char *)");
}

Assistant:

int cmime_message_set_body(CMimeMessage_T *message, const char *content) {
    CMimePart_T *p = NULL;
    CMimeInfo_T *mi = NULL;

    assert(message);
    assert(content);  

    /* check if message object has a boundary and more the 1 mime parts */ 
    if ((message->boundary != NULL) && (message->parts->size > 1))
        return(-1);

    if (message->parts->size == 1) {
        p = (CMimePart_T *)cmime_list_pop_head(message->parts);
        cmime_part_free(p);
    }
    
    mi = cmime_util_info_get_from_string(content);
    if (mi!=NULL) {
        if (mi->combined != NULL)
            cmime_message_set_content_type(message, mi->combined);

        cmime_util_info_free(mi);
    }

    p = cmime_part_new();    
    cmime_part_set_content(p,content);
    cmime_list_append(message->parts,p);

    /* check message gap */
    if (message->gap == NULL) {
        if (message->linebreak != NULL)
            message->gap = strdup(message->linebreak);
        else
            message->gap = strdup(CRLF);
    }

    return(0);
}